

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_main.c
# Opt level: O0

void vlogprintf(char *fmt,__va_list_tag *ap)

{
  undefined8 uStack_38;
  va_list lfap;
  __va_list_tag *ap_local;
  char *fmt_local;
  
  lfap[0].overflow_arg_area = ap->reg_save_area;
  uStack_38._0_4_ = ap->gp_offset;
  uStack_38._4_4_ = ap->fp_offset;
  lfap[0]._0_8_ = ap->overflow_arg_area;
  if (log_console != L'\0') {
    vfprintf(_stdout,fmt,ap);
  }
  if (logfile != (FILE *)0x0) {
    vfprintf((FILE *)logfile,fmt,&uStack_38);
  }
  return;
}

Assistant:

static void __LA_PRINTFLIKE(1, 0)
vlogprintf(const char *fmt, va_list ap)
{
#ifdef va_copy
	va_list lfap;
	va_copy(lfap, ap);
#endif
	if (log_console)
		vfprintf(stdout, fmt, ap);
	if (logfile != NULL)
#ifdef va_copy
		vfprintf(logfile, fmt, lfap);
	va_end(lfap);
#else
		vfprintf(logfile, fmt, ap);
#endif
}